

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O3

void QtGuiTest::synthesizeWheelEvent(int rollCount,KeyboardModifiers modifiers)

{
  QDebug QVar1;
  bool bVar2;
  QPoint QVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QPointF local_78;
  undefined4 uStack_68;
  undefined4 local_64;
  char *local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  QPointF local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78.xp._0_4_ = 2;
    local_78.xp._4_4_ = 0;
    local_78.yp._0_4_ = 0;
    local_78.yp._4_4_ = 0;
    uStack_68 = 0;
    local_64 = 0;
    local_60 = lcQtGuiTest::category.name;
    QMessageLogger::debug();
    QVar1.stream = local_58.stream;
    QVar4.m_data = (storage_type *)0x19;
    QVar4.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(&(QVar1.stream)->ts,(QString *)&local_40);
    if ((QArrayData *)local_40.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_40.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_40.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_40.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40.xp,2,0x10);
      }
    }
    if ((local_58.stream)->space == true) {
      QTextStream::operator<<(&(local_58.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_58.stream)->ts,rollCount);
    if ((local_58.stream)->space == true) {
      QTextStream::operator<<(&(local_58.stream)->ts,' ');
    }
    local_50.stream = local_58.stream;
    (local_58.stream)->ref = (local_58.stream)->ref + 1;
    qt_QMetaEnum_flagDebugOperator
              ((QDebug *)&local_48,(ulonglong)&local_50,
               (QMetaObject *)
               (ulong)(uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i,
               (char *)&Qt::staticMetaObject);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
  }
  QVar3 = QCursor::pos();
  local_40.xp = (qreal)QVar3.xp.m_i.m_i;
  local_40.yp = (qreal)QVar3.yp.m_i.m_i;
  local_78.xp = local_40.xp;
  local_78.yp = local_40.yp;
  bVar2 = QWindowSystemInterface::handleWheelEvent
                    ((QWindow *)0x0,&local_78,&local_40,(QPoint)0x0,
                     (QPoint)((ulong)(uint)-rollCount << 0x20),modifiers,NoScrollPhase,
                     MouseEventNotSynthesized);
  if (bVar2) {
    QCoreApplication::sendPostedEvents((QObject *)0x0,0);
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_0031b3eb;
    local_78.xp._0_4_ = 2;
    local_78.xp._4_4_ = 0;
    local_78.yp._0_4_ = 0;
    local_78.yp._4_4_ = 0;
    uStack_68 = 0;
    local_64 = 0;
    local_60 = lcQtGuiTest::category.name;
    QMessageLogger::debug();
  }
  else {
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_0031b3eb;
    local_78.xp._0_4_ = 2;
    local_78.xp._4_4_ = 0;
    local_78.yp._0_4_ = 0;
    local_78.yp._4_4_ = 0;
    uStack_68 = 0;
    local_64 = 0;
    local_60 = lcQtGuiTest::category.name;
    QMessageLogger::debug();
  }
  QVar1.stream = local_58.stream;
  QVar5.m_data = (storage_type *)0x9;
  QVar5.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(&(QVar1.stream)->ts,(QString *)&local_40);
  if ((QArrayData *)local_40.xp != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_40.xp)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_40.xp)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_40.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_40.xp,2,0x10);
    }
  }
  if ((local_58.stream)->space == true) {
    QTextStream::operator<<(&(local_58.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_58);
LAB_0031b3eb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QtGuiTest::synthesizeWheelEvent(int rollCount, Qt::KeyboardModifiers modifiers)
{
    deb << "Synthesizing wheel event:" << rollCount << modifiers;

    QPoint position = QCursor::pos();
    if (QWindowSystemInterface::handleWheelEvent(nullptr, position, position,
                                                 QPoint(), QPoint(0, -rollCount), modifiers)) {

        // It's unlikely that a shortcut relates to a subsequent wheel event.
        // But it's not harmful, to send posted events here.
        QCoreApplication::sendPostedEvents();
        deb << "(success)";
    } else {
        deb << "(failure)";
    }
}